

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O2

double __thiscall TankMixModel::storedMass(TankMixModel *this)

{
  Segment *pSVar1;
  Segment **ppSVar2;
  double dVar3;
  
  dVar3 = 0.0;
  ppSVar2 = &this->firstSeg;
  while (pSVar1 = *ppSVar2, pSVar1 != (Segment *)0x0) {
    dVar3 = dVar3 + pSVar1->c * pSVar1->v;
    ppSVar2 = &pSVar1->next;
  }
  return dVar3;
}

Assistant:

double TankMixModel::storedMass()
{
    double totalMass = 0.0;
    Segment* seg = firstSeg;
    while (seg)
    {
        totalMass += seg->c * seg->v;
        seg = seg->next;
    }
    return totalMass;
}